

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoding.c
# Opt level: O1

exr_result_t unpack_sample_table(exr_const_context_t ctxt,exr_decode_pipeline_t *decode)

{
  uint uVar1;
  uint uVar2;
  int32_t *piVar3;
  exr_result_t eVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  bool bVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  int32_t *piVar14;
  ulong uVar15;
  ulong uVar16;
  bool bVar17;
  bool bVar18;
  
  uVar1 = (decode->chunk).height;
  uVar7 = (ulong)uVar1;
  uVar2 = (decode->chunk).width;
  lVar5 = (long)(int)uVar2;
  if ((long)decode->channel_count < 1) {
    lVar6 = 0;
  }
  else {
    lVar12 = 0;
    lVar6 = 0;
    do {
      lVar6 = lVar6 + (&decode->channels->bytes_per_element)[lVar12];
      lVar12 = lVar12 + 0x30;
    } while ((long)decode->channel_count * 0x30 != lVar12);
  }
  piVar3 = decode->sample_count_table;
  bVar17 = 0 < (int)uVar1;
  if ((decode->decode_flags & 1) == 0) {
    if ((int)uVar1 < 1) {
      uVar13 = 0;
    }
    else {
      uVar16 = 0;
      uVar13 = 0;
      piVar14 = piVar3;
      do {
        if (((int)uVar2 < 1) || (piVar3[uVar16 * lVar5] < 0)) {
          uVar10 = 0;
          bVar9 = 0 < (int)uVar2;
        }
        else {
          uVar10 = 1;
          uVar1 = piVar3[uVar16 * lVar5];
          do {
            uVar15 = uVar10;
            uVar10 = (ulong)uVar1;
            if (uVar2 == uVar15) goto LAB_0012f810;
            bVar9 = (int)uVar1 <= piVar14[uVar15];
            uVar10 = uVar15 + 1;
            uVar1 = piVar14[uVar15];
          } while (bVar9);
          uVar10 = 0;
LAB_0012f810:
          bVar9 = (long)uVar15 < lVar5;
        }
        uVar13 = uVar13 + uVar10;
        if (bVar9) break;
        uVar16 = uVar16 + 1;
        bVar17 = uVar16 < uVar7;
        piVar14 = piVar14 + lVar5;
      } while (uVar16 != uVar7);
    }
    if (bVar17) {
      return 0x1f;
    }
    if (0x7ffffffe < uVar13) {
      return 0x1f;
    }
  }
  else {
    if ((int)uVar1 < 1) {
      uVar13 = 0;
    }
    else {
      uVar16 = 0;
      uVar13 = 0;
      piVar14 = piVar3;
      do {
        bVar9 = 0 < (int)uVar2;
        if ((int)uVar2 < 1) {
          uVar10 = 0;
        }
        else {
          uVar10 = 1;
          uVar11 = 0;
          do {
            uVar8 = piVar14[uVar10 - 1];
            if ((int)uVar8 < (int)uVar11) {
              uVar8 = 0;
              break;
            }
            piVar14[uVar10 - 1] = uVar8 - uVar11;
            bVar9 = (long)uVar10 < lVar5;
            bVar18 = uVar10 != uVar2;
            uVar10 = uVar10 + 1;
            uVar11 = uVar8;
          } while (bVar18);
          uVar10 = (ulong)uVar8;
        }
        uVar13 = uVar13 + uVar10;
        if (bVar9) break;
        uVar16 = uVar16 + 1;
        bVar17 = uVar16 < uVar7;
        piVar14 = piVar14 + lVar5;
      } while (uVar16 != uVar7);
    }
    if (bVar17) {
      return 0x1f;
    }
    if (0x7ffffffe < uVar13) {
      return 0x1f;
    }
    piVar3[(int)(uVar1 * uVar2)] = (int32_t)uVar13;
  }
  uVar7 = (decode->chunk).unpacked_size;
  if (uVar13 * lVar6 < uVar7 || uVar13 * lVar6 - uVar7 == 0) {
    return 0;
  }
  eVar4 = (*ctxt->report_error)(ctxt,0x1f,"Corrupt sample count table");
  return eVar4;
}

Assistant:

static exr_result_t
unpack_sample_table (exr_const_context_t ctxt, exr_decode_pipeline_t* decode)
{
    exr_result_t rv           = EXR_ERR_SUCCESS;
    int32_t      w            = decode->chunk.width;
    int32_t      h            = decode->chunk.height;
    uint64_t     totsamp      = 0;
    int32_t*     samptable    = decode->sample_count_table;
    size_t       combSampSize = 0;

    for (int c = 0; c < decode->channel_count; ++c)
        combSampSize += ((size_t) decode->channels[c].bytes_per_element);

    if ((decode->decode_flags & EXR_DECODE_SAMPLE_COUNTS_AS_INDIVIDUAL))
    {
        for (int32_t y = 0; y < h; ++y)
        {
            int32_t* cursampline = samptable + y * w;
            int32_t  prevsamp    = 0;
            for (int32_t x = 0; x < w; ++x)
            {
                int32_t nsamps =
                    (int32_t) one_to_native32 ((uint32_t) cursampline[x]);
                // not monotonic, violation
                if (nsamps < prevsamp) return EXR_ERR_INVALID_SAMPLE_DATA;
                cursampline[x] = nsamps - prevsamp;
                prevsamp       = nsamps;
            }
            totsamp += (uint64_t) prevsamp;
        }
        if (totsamp >= (uint64_t) INT32_MAX) return EXR_ERR_INVALID_SAMPLE_DATA;
        samptable[w * h] = (int32_t) totsamp;
    }
    else
    {
        for (int32_t y = 0; y < h; ++y)
        {
            int32_t* cursampline = samptable + y * w;
            int32_t  prevsamp    = 0;
            for (int32_t x = 0; x < w; ++x)
            {
                int32_t nsamps =
                    (int32_t) one_to_native32 ((uint32_t) cursampline[x]);
                // not monotonic, violation
                if (nsamps < prevsamp) return EXR_ERR_INVALID_SAMPLE_DATA;

                cursampline[x] = nsamps;
                prevsamp       = nsamps;
            }

            totsamp += (uint64_t) prevsamp;
        }
        if (totsamp >= (uint64_t) INT32_MAX) return EXR_ERR_INVALID_SAMPLE_DATA;
    }

    if ((totsamp * combSampSize) > decode->chunk.unpacked_size)
    {
        rv = ctxt->report_error (
            ctxt, EXR_ERR_INVALID_SAMPLE_DATA, "Corrupt sample count table");
    }

    return rv;
}